

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DoubleDatatypeValidator.cpp
# Opt level: O3

XSerializable * xercesc_4_0::DoubleDatatypeValidator::createObject(MemoryManager *manager)

{
  DoubleDatatypeValidator *this;
  
  this = (DoubleDatatypeValidator *)XMemory::operator_new(0xa0,manager);
  DoubleDatatypeValidator(this,manager);
  return (XSerializable *)this;
}

Assistant:

void DoubleDatatypeValidator::serialize(XSerializeEngine& serEng)
{
    /***
     * Note: 
     *
     *     During storing, we need write the specific number
     *     type info before calling base::serialize().
     *
     *     While loading, we do nothing here
     ***/

    if (serEng.isStoring())
    {
        serEng<<(int) (XMLNumber::Double);
    }

    AbstractNumericValidator::serialize(serEng);

}